

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O2

void mg_printf_websocket_frame(mg_connection *nc,int op,char *fmt,...)

{
  char *__ptr;
  char in_AL;
  uint uVar1;
  undefined8 in_RCX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  char *buf;
  va_list ap;
  undefined1 local_138 [24];
  undefined8 local_120;
  undefined8 local_118;
  undefined8 local_110;
  undefined8 local_108;
  undefined8 local_f8;
  undefined8 local_e8;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  char mem [100];
  
  ap[0].reg_save_area = local_138;
  if (in_AL != '\0') {
    local_108 = in_XMM0_Qa;
    local_f8 = in_XMM1_Qa;
    local_e8 = in_XMM2_Qa;
    local_d8 = in_XMM3_Qa;
    local_c8 = in_XMM4_Qa;
    local_b8 = in_XMM5_Qa;
    local_a8 = in_XMM6_Qa;
    local_98 = in_XMM7_Qa;
  }
  ap[0].overflow_arg_area = &stack0x00000008;
  ap[0].gp_offset = 0x18;
  ap[0].fp_offset = 0x30;
  buf = mem;
  local_120 = in_RCX;
  local_118 = in_R8;
  local_110 = in_R9;
  uVar1 = mg_avprintf(&buf,100,fmt,ap);
  __ptr = buf;
  if (0 < (int)uVar1) {
    mg_send_websocket_frame(nc,op,buf,(ulong)uVar1);
  }
  if (__ptr != (char *)0x0 && __ptr != mem) {
    free(__ptr);
  }
  return;
}

Assistant:

void mg_printf_websocket_frame(struct mg_connection *nc, int op,
                               const char *fmt, ...) {
    char mem[MG_VPRINTF_BUFFER_SIZE], *buf = mem;
    va_list ap;
    int len;

    va_start(ap, fmt);
    if ((len = mg_avprintf(&buf, sizeof(mem), fmt, ap)) > 0) {
        mg_send_websocket_frame(nc, op, buf, len);
    }
    va_end(ap);

    if (buf != mem && buf != NULL) {
        MG_FREE(buf);
    }
}